

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_check_mandatory_tree
              (lyd_node *root,ly_ctx *ctx,lys_module **modules,int mod_count,int options)

{
  lys_module *plVar1;
  int iVar2;
  lys_node *plVar3;
  char *format;
  ulong uVar4;
  long lVar5;
  
  if (root == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    __assert_fail("root || ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x354,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if (((uint)options >> 8 & 1) != 0) {
    __assert_fail("!(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x355,
                  "int lyd_check_mandatory_tree(struct lyd_node *, struct ly_ctx *, const struct lys_module **, int, int)"
                 );
  }
  if ((options & 0xeU) != 0) {
    return 0;
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = root->schema->module->ctx;
  }
  if ((options & 0x10000f1U) == 0 || (options & 1U) != 0) {
    if (((uint)options >> 0xc & 1) == 0) {
      if (mod_count != 0 && modules != (lys_module **)0x0) {
        if (mod_count < 1) {
          return 0;
        }
        uVar4 = 0;
        do {
          for (plVar3 = modules[uVar4]->data; plVar3 != (lys_node *)0x0; plVar3 = plVar3->next) {
            if (((plVar3->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
               (iVar2 = lyd_check_mandatory_subtree
                                  (root,(lyd_node *)0x0,(lyd_node *)0x0,plVar3,1,options),
               iVar2 != 0)) {
              return 1;
            }
          }
          uVar4 = uVar4 + 1;
          if (uVar4 == (uint)mod_count) {
            return 0;
          }
        } while( true );
      }
      lVar5 = ((ulong)ctx->internal_module_count - 1) + (ulong)(((uint)options >> 0x10 & 1) != 0);
      iVar2 = (ctx->models).used;
      if (iVar2 <= (int)lVar5) {
        return 0;
      }
      do {
        plVar1 = (ctx->models).list[lVar5];
        if (((*(ushort *)&plVar1->field_0x40 & 0xc0) == 0x80) &&
           (plVar3 = plVar1->data, plVar3 != (lys_node *)0x0)) {
          do {
            if (((plVar3->nodetype & (LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) &&
               (iVar2 = lyd_check_mandatory_subtree
                                  (root,(lyd_node *)0x0,(lyd_node *)0x0,plVar3,1,options),
               iVar2 != 0)) {
              return 1;
            }
            plVar3 = plVar3->next;
          } while (plVar3 != (lys_node *)0x0);
          iVar2 = (ctx->models).used;
        }
        lVar5 = lVar5 + 1;
        if (iVar2 <= lVar5) {
          return 0;
        }
      } while( true );
    }
LAB_00163d99:
    if (root == (lyd_node *)0x0) {
      return 0;
    }
    iVar2 = lyd_check_mandatory_subtree(root,(lyd_node *)0x0,(lyd_node *)0x0,root->schema,1,options)
    ;
  }
  else {
    if ((options & 0x40U) == 0) {
      if ((options & 0x30U) == 0) {
        if (((uint)options >> 0x18 & 1) == 0) {
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0x399);
          return 1;
        }
        goto LAB_00163d99;
      }
      if ((root == (lyd_node *)0x0) ||
         ((root->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
        format = "Subtree is not a single RPC/action/reply.";
        goto LAB_00163d50;
      }
      plVar3 = root->schema->child;
      if ((options & 0x10U) == 0) {
        while( true ) {
          if (plVar3 == (lys_node *)0x0) {
            return 0;
          }
          if (plVar3->nodetype == LYS_OUTPUT) break;
          plVar3 = plVar3->next;
        }
      }
      else {
        while( true ) {
          if (plVar3 == (lys_node *)0x0) {
            return 0;
          }
          if (plVar3->nodetype == LYS_INPUT) break;
          plVar3 = plVar3->next;
        }
      }
    }
    else {
      if ((root == (lyd_node *)0x0) || (plVar3 = root->schema, plVar3->nodetype != LYS_NOTIF)) {
        format = "Subtree is not a single notification.";
LAB_00163d50:
        ly_log(ctx,LY_LLERR,LY_EINVAL,format);
        return 1;
      }
      if (plVar3->child == (lys_node *)0x0) {
        return 0;
      }
    }
    iVar2 = lyd_check_mandatory_subtree(root,root,root,plVar3,0,options);
  }
  if (iVar2 == 0) {
    return 0;
  }
  return 1;
}

Assistant:

int
lyd_check_mandatory_tree(struct lyd_node *root, struct ly_ctx *ctx, const struct lys_module **modules, int mod_count,
                         int options)
{
    struct lys_node *siter;
    int i;

    assert(root || ctx);
    assert(!(options & LYD_OPT_ACT_NOTIF));

    if (options & (LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG)) {
        /* no check is needed */
        return EXIT_SUCCESS;
    }

    if (!ctx) {
        /* get context */
        ctx = root->schema->module->ctx;
    }

    if (!(options & LYD_OPT_TYPEMASK) || (options & LYD_OPT_CONFIG)) {
        if (options & LYD_OPT_NOSIBLINGS) {
            if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
                return EXIT_FAILURE;
            }
        } else if (modules && mod_count) {
            for (i = 0; i < mod_count; ++i) {
                LY_TREE_FOR(modules[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        } else {
            for (i = (options & LYD_OPT_DATA_NO_YANGLIB) ? ctx->internal_module_count : ctx->internal_module_count - 1;
                 i < ctx->models.used;
                 i++) {
                /* skip not implemented and disabled modules */
                if (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled) {
                    continue;
                }
                LY_TREE_FOR(ctx->models.list[i]->data, siter) {
                    if (!(siter->nodetype & (LYS_RPC | LYS_NOTIF)) &&
                            lyd_check_mandatory_subtree(root, NULL, NULL, siter, 1, options)) {
                        return EXIT_FAILURE;
                    }
                }
            }
        }
    } else if (options & LYD_OPT_NOTIF) {
        if (!root || (root->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single notification.");
            return EXIT_FAILURE;
        }
        if (root->schema->child && lyd_check_mandatory_subtree(root, root, root, root->schema, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY)) {
        if (!root || !(root->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
            LOGERR(ctx, LY_EINVAL, "Subtree is not a single RPC/action/reply.");
            return EXIT_FAILURE;
        }
        if (options & LYD_OPT_RPC) {
            for (siter = root->schema->child; siter && siter->nodetype != LYS_INPUT; siter = siter->next);
        } else { /* LYD_OPT_RPCREPLY */
            for (siter = root->schema->child; siter && siter->nodetype != LYS_OUTPUT; siter = siter->next);
        }
        if (siter && lyd_check_mandatory_subtree(root, root, root, siter, 0, options)) {
            return EXIT_FAILURE;
        }
    } else if (options & LYD_OPT_DATA_TEMPLATE) {
        if (root && lyd_check_mandatory_subtree(root, NULL, NULL, root->schema, 1, options)) {
            return EXIT_FAILURE;
        }
    } else {
        LOGINT(ctx);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}